

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

int * inform_random_ints(int a,int b,size_t n)

{
  int iVar1;
  ulong local_30;
  size_t i;
  int *xs;
  size_t n_local;
  int b_local;
  int a_local;
  
  _b_local = (int *)malloc(n << 2);
  if (_b_local == (int *)0x0) {
    _b_local = (int *)0x0;
  }
  else {
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      iVar1 = inform_random_int(a,b);
      _b_local[local_30] = iVar1;
    }
  }
  return _b_local;
}

Assistant:

int *inform_random_ints(int a, int b, size_t n)
{
    int *xs = malloc(n * sizeof(int));
    if (xs == NULL)
        return NULL;
    for (size_t i = 0; i < n; ++i)
        xs[i] = inform_random_int(a, b);
    return xs;
}